

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 float64_to_floatx80_mips64el(float64 a,float_status *status)

{
  commonNaNT a_00;
  floatx80 fVar1;
  commonNaNT local_50;
  uint64_t local_38;
  uint64_t aSig;
  int aExp;
  flag aSign;
  float_status *status_local;
  float64 a_local;
  uint16_t local_10;
  
  _aExp = status;
  status_local = (float_status *)a;
  status_local = (float_status *)float64_squash_input_denormal_mips64el(a,status);
  local_38 = extractFloat64Frac((float64)status_local);
  aSig._0_4_ = extractFloat64Exp((float64)status_local);
  aSig._7_1_ = extractFloat64Sign((float64)status_local);
  if ((int)aSig == 0x7ff) {
    if (local_38 == 0) {
      fVar1 = packFloatx80(aSig._7_1_,0x7fff,0x8000000000000000);
      local_10 = fVar1.high;
    }
    else {
      float64ToCommonNaN(&local_50,(float64)status_local,_aExp);
      a_00.high = local_50.high;
      a_00.sign = local_50.sign;
      a_00._1_7_ = local_50._1_7_;
      a_00.low = local_50.low;
      fVar1 = commonNaNToFloatx80(a_00,_aExp);
      local_10 = fVar1.high;
    }
  }
  else {
    if ((int)aSig == 0) {
      if (local_38 == 0) {
        fVar1 = packFloatx80(aSig._7_1_,0,0);
        local_10 = fVar1.high;
        goto LAB_00c65121;
      }
      normalizeFloat64Subnormal(local_38,(int *)&aSig,&local_38);
    }
    fVar1 = packFloatx80(aSig._7_1_,(int)aSig + 0x3c00,(local_38 | 0x10000000000000) << 0xb);
    local_10 = fVar1.high;
  }
LAB_00c65121:
  a_local = fVar1.low;
  fVar1.high = local_10;
  fVar1.low = a_local;
  return fVar1;
}

Assistant:

floatx80 float64_to_floatx80(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloatx80(float64ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    return
        packFloatx80(
            aSign, aExp + 0x3C00, (aSig | UINT64_C(0x0010000000000000)) << 11);

}